

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> __thiscall
slang::parseList(slang *this,string_view value,bool allowCommaList,
                SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *splitMem)

{
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> *this_00
  ;
  size_type __n;
  undefined7 in_register_00000009;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  this_00 = (span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
             *)CONCAT71(in_register_00000009,allowCommaList);
  local_50._M_str = (char *)value._M_len;
  local_50._M_len = (size_t)this;
  if ((int)value._M_str != 0) {
    while( true ) {
      __n = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_50,',',0);
      if (__n == 0xffffffffffffffff) break;
      local_40 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_50,0,__n);
      SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                ((SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *)this_00,
                 &local_40);
      local_50 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&local_50,__n + 1,0xffffffffffffffff);
    }
  }
  SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
            ((SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *)this_00,
             &local_50);
  return *this_00;
}

Assistant:

static std::span<const std::string_view> parseList(std::string_view value, bool allowCommaList,
                                                   SmallVector<std::string_view>& splitMem) {
    if (allowCommaList) {
        while (true) {
            auto index = value.find_first_of(',');
            if (index == std::string_view::npos)
                break;

            splitMem.push_back(value.substr(0, index));
            value = value.substr(index + 1);
        }
    }
    splitMem.push_back(value);
    return splitMem;
}